

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O1

ostream * Eigen::internal::print_matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
                    (ostream *s,Matrix<double,__1,_1,_0,__1,_1> *_m,IOFormat *fmt)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  stringstream sstr;
  undefined8 local_1e8;
  undefined1 *local_1d8;
  long local_1d0;
  undefined1 local_1c8 [16];
  long local_1b8 [16];
  ios_base local_138 [264];
  
  if ((_m->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows == 0) {
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (s,(fmt->matPrefix)._M_dataplus._M_p,(fmt->matPrefix)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(fmt->matSuffix)._M_dataplus._M_p,(fmt->matSuffix)._M_string_length);
  }
  else {
    lVar2 = (long)fmt->precision;
    if (lVar2 == -1) {
      lVar2 = 0;
    }
    else if (fmt->precision == -2) {
      lVar2 = 0x10;
    }
    if (lVar2 == 0) {
      local_1e8 = 0;
    }
    else {
      local_1e8 = *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 8);
      *(long *)(s + *(long *)(*(long *)s + -0x18) + 8) = lVar2;
    }
    if (((fmt->flags & 1) == 0) &&
       (0 < (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows))
    {
      lVar3 = 0;
      lVar4 = 0;
      do {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::ios::copyfmt((ios *)((stringstream *)local_1b8 + *(long *)(local_1b8[0] + -0x18)));
        std::ostream::_M_insert<double>
                  ((_m->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data[lVar3]);
        std::__cxx11::stringbuf::str();
        if (lVar4 <= local_1d0) {
          lVar4 = local_1d0;
        }
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
        lVar3 = lVar3 + 1;
      } while (lVar3 < (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_rows);
    }
    else {
      lVar4 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (s,(fmt->matPrefix)._M_dataplus._M_p,(fmt->matPrefix)._M_string_length);
    if (0 < (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      lVar3 = 0;
      do {
        if (lVar3 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (s,(fmt->rowSpacer)._M_dataplus._M_p,(fmt->rowSpacer)._M_string_length);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (s,(fmt->rowPrefix)._M_dataplus._M_p,(fmt->rowPrefix)._M_string_length);
        if (lVar4 != 0) {
          *(long *)(s + *(long *)(*(long *)s + -0x18) + 0x10) = lVar4;
        }
        std::ostream::_M_insert<double>
                  ((_m->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data[lVar3]);
        std::__ostream_insert<char,std::char_traits<char>>
                  (s,(fmt->rowSuffix)._M_dataplus._M_p,(fmt->rowSuffix)._M_string_length);
        if (lVar3 < (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_rows + -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (s,(fmt->rowSeparator)._M_dataplus._M_p,(fmt->rowSeparator)._M_string_length);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_rows);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (s,(fmt->matSuffix)._M_dataplus._M_p,(fmt->matSuffix)._M_string_length);
    if (lVar2 != 0) {
      *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 8) = local_1e8;
    }
  }
  return s;
}

Assistant:

std::ostream & print_matrix(std::ostream & s, const Derived& _m, const IOFormat& fmt)
{
  if(_m.size() == 0)
  {
    s << fmt.matPrefix << fmt.matSuffix;
    return s;
  }
  
  typename Derived::Nested m = _m;
  typedef typename Derived::Scalar Scalar;
  typedef typename Derived::Index Index;

  Index width = 0;

  std::streamsize explicit_precision;
  if(fmt.precision == StreamPrecision)
  {
    explicit_precision = 0;
  }
  else if(fmt.precision == FullPrecision)
  {
    if (NumTraits<Scalar>::IsInteger)
    {
      explicit_precision = 0;
    }
    else
    {
      explicit_precision = significant_decimals_impl<Scalar>::run();
    }
  }
  else
  {
    explicit_precision = fmt.precision;
  }

  std::streamsize old_precision = 0;
  if(explicit_precision) old_precision = s.precision(explicit_precision);

  bool align_cols = !(fmt.flags & DontAlignCols);
  if(align_cols)
  {
    // compute the largest width
    for(Index j = 0; j < m.cols(); ++j)
      for(Index i = 0; i < m.rows(); ++i)
      {
        std::stringstream sstr;
        sstr.copyfmt(s);
        sstr << m.coeff(i,j);
        width = std::max<Index>(width, Index(sstr.str().length()));
      }
  }
  s << fmt.matPrefix;
  for(Index i = 0; i < m.rows(); ++i)
  {
    if (i)
      s << fmt.rowSpacer;
    s << fmt.rowPrefix;
    if(width) s.width(width);
    s << m.coeff(i, 0);
    for(Index j = 1; j < m.cols(); ++j)
    {
      s << fmt.coeffSeparator;
      if (width) s.width(width);
      s << m.coeff(i, j);
    }
    s << fmt.rowSuffix;
    if( i < m.rows() - 1)
      s << fmt.rowSeparator;
  }
  s << fmt.matSuffix;
  if(explicit_precision) s.precision(old_precision);
  return s;
}